

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combination.c
# Opt level: O1

Aig_Man_t * generateDisjunctiveTester(Abc_Ntk_t *pNtk,Aig_Man_t *pAig,int combN,int combK)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *vCandidateMonotoneSignals_;
  Aig_Man_t *p;
  size_t sVar3;
  char *__s;
  Aig_Obj_t *pAVar4;
  long lVar5;
  uint *puVar6;
  void *pvVar7;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  uint *puVar11;
  ulong uVar12;
  Aig_Obj_t *p1;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  bool bVar20;
  int local_74;
  int local_38;
  
  vCandidateMonotoneSignals_ = findHintOutputs(pNtk);
  if (vCandidateMonotoneSignals_ == (Vec_Int_t *)0x0) {
    puts("\nTraget Signal Set is Empty: Duplicating given AIG");
    local_74 = 0;
  }
  else {
    if ((long)vCandidateMonotoneSignals_->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    local_74 = (vCandidateMonotoneSignals_->pArray[(long)vCandidateMonotoneSignals_->nSize + -1] -
               *vCandidateMonotoneSignals_->pArray) + 1;
  }
  p = Aig_ManStart(pAig->vObjs->nSize);
  sVar3 = strlen(pAig->pName);
  __s = (char *)malloc(sVar3 + 5);
  p->pName = __s;
  iVar17 = 0;
  sprintf(__s,"%s_%s",pAig->pName,"nCk");
  p->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < pAig->nTruePis) {
    lVar14 = 0;
    do {
      if (pAig->vCis->nSize <= lVar14) goto LAB_00592216;
      pvVar7 = pAig->vCis->pArray[lVar14];
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar4;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pAig->nTruePis);
  }
  if (0 < pAig->nRegs) {
    iVar17 = 0;
    do {
      uVar2 = pAig->nTruePis + iVar17;
      if (((int)uVar2 < 0) || (pAig->vCis->nSize <= (int)uVar2)) goto LAB_00592216;
      pvVar7 = pAig->vCis->pArray[uVar2];
      iVar17 = iVar17 + 1;
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar4;
    } while (iVar17 < pAig->nRegs);
  }
  if (combK < 1) {
    lVar14 = 0;
  }
  else {
    uVar18 = 1;
    lVar14 = 0;
    do {
      lVar5 = countCombination((long)local_74,uVar18);
      lVar14 = lVar14 + lVar5;
      uVar18 = uVar18 + 1;
    } while (combK + 1 != uVar18);
  }
  if (lVar14 < 1) {
    __assert_fail("lCombinationCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/combination.c"
                  ,0xde,"Aig_Man_t *generateDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int, int)");
  }
  puVar6 = (uint *)malloc(0x10);
  uVar2 = 8;
  if (6 < (uint)lVar14 - 1) {
    uVar2 = (uint)lVar14;
  }
  puVar6[1] = 0;
  *puVar6 = uVar2;
  lVar5 = (long)(int)uVar2;
  if (uVar2 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc(lVar5 * 8);
  }
  *(void **)(puVar6 + 2) = pvVar7;
  lVar15 = 1;
  lVar8 = 1;
  if (1 < lVar14) {
    lVar15 = lVar14;
    lVar8 = lVar14;
  }
  do {
    pAVar4 = Aig_ObjCreateCi(p);
    uVar1 = puVar6[1];
    uVar16 = *puVar6;
    if (uVar1 == uVar16) {
      if ((int)uVar16 < 0x10) {
        if (*(void **)(puVar6 + 2) == (void *)0x0) {
          pvVar7 = malloc(0x80);
        }
        else {
          pvVar7 = realloc(*(void **)(puVar6 + 2),0x80);
        }
        uVar19 = 0x10;
      }
      else {
        uVar19 = uVar16 * 2;
        if ((int)uVar19 <= (int)uVar16) goto LAB_00591dee;
        if (*(void **)(puVar6 + 2) == (void *)0x0) {
          pvVar7 = malloc((ulong)uVar16 << 4);
        }
        else {
          pvVar7 = realloc(*(void **)(puVar6 + 2),(ulong)uVar16 << 4);
        }
      }
      *(void **)(puVar6 + 2) = pvVar7;
      *puVar6 = uVar19;
    }
LAB_00591dee:
    puVar6[1] = uVar1 + 1;
    *(Aig_Obj_t **)(*(long *)(puVar6 + 2) + (long)(int)uVar1 * 8) = pAVar4;
    lVar15 = lVar15 + -1;
  } while (lVar15 != 0);
  pVVar9 = pAig->vObjs;
  if (0 < pVVar9->nSize) {
    lVar15 = 0;
    do {
      pvVar7 = pVVar9->pArray[lVar15];
      if ((pvVar7 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar7 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar7 & 1) != 0) goto LAB_00592235;
        uVar18 = *(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe;
        if (uVar18 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar7 + 8) & 1) ^ *(ulong *)(uVar18 + 0x28));
        }
        uVar18 = *(ulong *)((long)pvVar7 + 0x10) & 0xfffffffffffffffe;
        if (uVar18 == 0) {
          p1 = (Aig_Obj_t *)0x0;
        }
        else {
          p1 = (Aig_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar7 + 0x10) & 1) ^ *(ulong *)(uVar18 + 0x28));
        }
        pAVar4 = Aig_And(p,pAVar4,p1);
        *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar4;
      }
      lVar15 = lVar15 + 1;
      pVVar9 = pAig->vObjs;
    } while (lVar15 < pVVar9->nSize);
  }
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nSize = 0;
  pVVar9->nCap = uVar2;
  if (uVar2 == 0) {
    ppvVar10 = (void **)0x0;
  }
  else {
    ppvVar10 = (void **)malloc(lVar5 * 8);
  }
  pVVar9->pArray = ppvVar10;
  if (0 < combK) {
    iVar13 = 1;
    do {
      generateCombinatorialStabil(p,pAig,vCandidateMonotoneSignals_,pVVar9,local_74,iVar13);
      bVar20 = iVar13 != combK;
      iVar13 = iVar13 + 1;
    } while (bVar20);
  }
  puVar11 = (uint *)malloc(0x10);
  puVar11[1] = 0;
  *puVar11 = uVar2;
  if (uVar2 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc(lVar5 << 3);
  }
  *(void **)(puVar11 + 2) = pvVar7;
  lVar5 = 1;
  if (1 < lVar14) {
    lVar5 = lVar14;
  }
  lVar15 = 0;
  do {
    if (((lVar15 == 0x80000000) || (uVar2 = (uint)lVar15, (int)puVar6[1] <= (int)uVar2)) ||
       (pVVar9->nSize <= (int)uVar2)) goto LAB_00592216;
    pAVar4 = Aig_Or(p,(Aig_Obj_t *)((ulong)pVVar9->pArray[uVar2 & 0x7fffffff] ^ 1),
                    *(Aig_Obj_t **)(*(long *)(puVar6 + 2) + (ulong)(uVar2 & 0x7fffffff) * 8));
    uVar2 = puVar11[1];
    uVar1 = *puVar11;
    if (uVar2 == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (*(void **)(puVar11 + 2) == (void *)0x0) {
          pvVar7 = malloc(0x80);
        }
        else {
          pvVar7 = realloc(*(void **)(puVar11 + 2),0x80);
        }
        uVar16 = 0x10;
      }
      else {
        uVar16 = uVar1 * 2;
        if ((int)uVar16 <= (int)uVar1) goto LAB_00592040;
        if (*(void **)(puVar11 + 2) == (void *)0x0) {
          pvVar7 = malloc((ulong)uVar1 << 4);
        }
        else {
          pvVar7 = realloc(*(void **)(puVar11 + 2),(ulong)uVar1 << 4);
        }
      }
      *(void **)(puVar11 + 2) = pvVar7;
      *puVar11 = uVar16;
    }
LAB_00592040:
    puVar11[1] = uVar2 + 1;
    *(Aig_Obj_t **)(*(long *)(puVar11 + 2) + (long)(int)uVar2 * 8) = pAVar4;
    lVar15 = lVar15 + 1;
  } while (lVar5 != lVar15);
  if (0 < pAig->nTruePos) {
    lVar5 = 0;
    do {
      if (pAig->vCos->nSize <= lVar5) goto LAB_00592216;
      pvVar7 = pAig->vCos->pArray[lVar5];
      if (((ulong)pvVar7 & 1) != 0) goto LAB_00592235;
      uVar18 = *(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe;
      if (uVar18 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar7 + 8) & 1) ^ *(ulong *)(uVar18 + 0x28));
      }
      pAVar4 = Aig_ObjCreateCo(p,pAVar4);
      *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 < pAig->nTruePos);
  }
  lVar5 = 1;
  if (1 < lVar14) {
    lVar5 = lVar14;
  }
  lVar15 = 0;
  do {
    if ((lVar15 == 0x80000000) || ((int)puVar11[1] <= (int)(uint)lVar15)) goto LAB_00592216;
    Aig_ObjCreateCo(p,*(Aig_Obj_t **)
                       (*(long *)(puVar11 + 2) + (ulong)((uint)lVar15 & 0x7fffffff) * 8));
    lVar15 = lVar15 + 1;
  } while (lVar5 != lVar15);
  if (pAig->nRegs < 1) {
    iVar13 = 0;
  }
  else {
    iVar13 = 0;
    do {
      uVar2 = pAig->nTruePos + iVar13;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) goto LAB_00592216;
      pvVar7 = pAig->vCos->pArray[uVar2];
      if (((ulong)pvVar7 & 1) != 0) {
LAB_00592235:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar18 = *(ulong *)((long)pvVar7 + 8);
      uVar12 = uVar18 & 0xfffffffffffffffe;
      if (uVar12 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)((ulong)((uint)uVar18 & 1) ^ *(ulong *)(uVar12 + 0x28));
      }
      iVar13 = iVar13 + 1;
      Aig_ObjCreateCo(p,pAVar4);
    } while (iVar13 < pAig->nRegs);
  }
  lVar5 = 1;
  if (1 < lVar14) {
    lVar5 = lVar14;
  }
  lVar14 = 0;
  while ((lVar14 != 0x80000000 && (uVar2 = (uint)lVar14, (int)uVar2 < (int)puVar11[1]))) {
    lVar14 = lVar14 + 1;
    Aig_ObjCreateCo(p,*(Aig_Obj_t **)(*(long *)(puVar11 + 2) + (ulong)(uVar2 & 0x7fffffff) * 8));
    if (lVar5 == lVar14) {
      local_38 = (int)lVar8;
      if (iVar13 + (int)lVar5 != iVar17 + local_38) {
        __assert_fail("liCopied + liCreated == loCopied + loCreated",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/combination.c"
                      ,0x136,
                      "Aig_Man_t *generateDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int, int)");
      }
      Aig_ManSetRegNum(p,iVar17 + local_38);
      Aig_ManCleanup(p);
      iVar17 = Aig_ManCheck(p);
      if (iVar17 == 0) {
        __assert_fail("Aig_ManCheck( pNewAig )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/combination.c"
                      ,0x13b,
                      "Aig_Man_t *generateDisjunctiveTester(Abc_Ntk_t *, Aig_Man_t *, int, int)");
      }
      return p;
    }
  }
LAB_00592216:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t *generateDisjunctiveTester( Abc_Ntk_t *pNtk, Aig_Man_t *pAig, int combN, int combK )
{
	//AIG creation related data structure
	Aig_Man_t *pNewAig;
	int piCopied = 0, loCopied = 0, loCreated = 0, liCopied = 0, liCreated = 0, poCopied = 0;
	//int i, iElem, nRegCount, hintSingalBeginningMarker, hintSingalEndMarker;
	int i, nRegCount, hintSingalBeginningMarker, hintSingalEndMarker;
	int combN_internal, combK_internal; //, targetPoIndex;
	long longI, lCombinationCount;
	//Aig_Obj_t *pObj, *pObjMonoCand, *pObjLO_nCk, *pObjDisj_nCk;
	Aig_Obj_t *pObj, *pObjLO_nCk, *pObjDisj_nCk;
	Vec_Ptr_t *vLO_nCk, *vPODriver_nCk, *vDisj_nCk;
	Vec_Int_t *vCandidateMonotoneSignals;

	extern Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk);
	
	//Knuth's Data Strcuture
	//Vec_Int_t *vC_KNUTH;
	//int i_KNUTH, j_KNUTH, combCounter_KNUTH = 0;

	//Collecting target HINT signals
	vCandidateMonotoneSignals = findHintOutputs(pNtk);
	if( vCandidateMonotoneSignals == NULL )
	{
		printf("\nTraget Signal Set is Empty: Duplicating given AIG\n");
		combN_internal = 0;
	}
	else
	{
		//Vec_IntForEachEntry( vCandidateMonotoneSignals, iElem, i )
		//	printf("Po[%d] = %s\n", iElem, Abc_ObjName( Abc_NtkPo(pNtk, iElem) ) );
		hintSingalBeginningMarker = Vec_IntEntry( vCandidateMonotoneSignals, 0 );
		hintSingalEndMarker = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntSize(vCandidateMonotoneSignals) - 1 );
		combN_internal = hintSingalEndMarker - hintSingalBeginningMarker + 1;
	}

	//combK_internal = combK;

	//Knuth's Data Structure Initialization
	//vC_KNUTH = Vec_IntAlloc(combK_internal+3);
	//for(i_KNUTH=-1; i_KNUTH<combK_internal; i_KNUTH++)
	//	Vec_IntPush( vC_KNUTH, i_KNUTH );
	//Vec_IntPush( vC_KNUTH, combN_internal );
	//Vec_IntPush( vC_KNUTH, 0 );

	//Standard AIG duplication begins
	//Standard AIG Manager Creation
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_nCk") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "nCk");
    	pNewAig->pSpec = NULL;

	//Standard Mapping of Constant Nodes
	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//Standard AIG PI duplication
	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//Standard AIG LO duplication
	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//nCk LO creation
	lCombinationCount = 0;
	for(combK_internal=1; combK_internal<=combK; combK_internal++)
		lCombinationCount += countCombination( combN_internal, combK_internal );
	assert( lCombinationCount > 0 );
	vLO_nCk = Vec_PtrAlloc(lCombinationCount);
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		loCreated++;
		pObj = Aig_ObjCreateCi(pNewAig);
		Vec_PtrPush( vLO_nCk, pObj );
	}

	//Standard Node duplication
	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//nCk specific logic creation (i.e. nCk number of OR gates)
	vDisj_nCk = Vec_PtrAlloc(lCombinationCount);

	

	//while(1)
	//{
	//	//visit combination
	//	//printf("Comb-%3d : ", ++combCounter_KNUTH);
	//	pObjMonoCand = Aig_Not(Aig_ManConst1(pNewAig));
	//	for( i_KNUTH=combK_internal; i_KNUTH>0; i_KNUTH--)
	//	{
	//		//printf("vC[%d] = %d ", i_KNUTH, Vec_IntEntry(vC_KNUTH, i_KNUTH));
	//		targetPoIndex = Vec_IntEntry( vCandidateMonotoneSignals, Vec_IntEntry(vC_KNUTH, i_KNUTH));
	//		pObj = Aig_ObjChild0Copy(Aig_ManCo( pAig, targetPoIndex ));
	//		pObjMonoCand = Aig_Or( pNewAig, pObj, pObjMonoCand );
	//	}
	//	Vec_PtrPush(vDisj_nCk, pObjMonoCand );
	//	//printf("\n");

	//	j_KNUTH = 1;
	//	while( Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 == Vec_IntEntry( vC_KNUTH, j_KNUTH+1 ) )
	//	{
	//		Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, j_KNUTH-1 );
	//		j_KNUTH = j_KNUTH + 1;
	//	}
	//	if( j_KNUTH > combK_internal ) break;
	//	Vec_IntWriteEntry( vC_KNUTH, j_KNUTH, Vec_IntEntry( vC_KNUTH, j_KNUTH ) + 1 );
	//}
	for( combK_internal=1; combK_internal<=combK; combK_internal++ )
		generateCombinatorialStabil( pNewAig, pAig, vCandidateMonotoneSignals,
				vDisj_nCk, combN_internal, combK_internal );


	//creation of implication logic
	vPODriver_nCk = Vec_PtrAlloc(lCombinationCount);
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		pObjLO_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vLO_nCk, longI ));
		pObjDisj_nCk = (Aig_Obj_t *)(Vec_PtrEntry( vDisj_nCk, longI ));

		pObj = Aig_Or( pNewAig, Aig_Not(pObjDisj_nCk), pObjLO_nCk);
		Vec_PtrPush(vPODriver_nCk, pObj);
	}
	
	//Standard PO duplication
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	//nCk specific PO creation
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
	}

	//Standard LI duplication
	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	//nCk specific LI creation
	for( longI = 0; longI < lCombinationCount; longI++ )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, (Aig_Obj_t *)(Vec_PtrEntry( vPODriver_nCk, longI )) );
	}

	//clean-up, book-keeping
	assert( liCopied + liCreated == loCopied + loCreated );	
	nRegCount = loCopied + loCreated;

	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	assert( Aig_ManCheck( pNewAig ) );
	
	//Vec_IntFree(vC_KNUTH);	
	return pNewAig;
}